

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double * uniform_01_order_sample(int n,int *seed)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  int iVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  uVar6 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar6 = (long)n * 8;
  }
  pdVar4 = (double *)operator_new__(uVar6);
  if (0 < n) {
    dVar7 = 1.0;
    uVar6 = (ulong)(uint)n;
    do {
      iVar2 = (*seed % 0x1f31d) * 0x41a7;
      iVar5 = (*seed / 0x1f31d) * -0xb14;
      iVar3 = iVar2 + iVar5;
      iVar2 = iVar2 + iVar5 + 0x7fffffff;
      if (-1 < iVar3) {
        iVar2 = iVar3;
      }
      *seed = iVar2;
      dVar8 = pow((double)iVar2 * 4.656612875e-10,1.0 / (double)(int)uVar6);
      dVar7 = dVar7 * dVar8;
      pdVar4[uVar6 - 1] = dVar7;
      bVar1 = 1 < (long)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar1);
  }
  return pdVar4;
}

Assistant:

double *uniform_01_order_sample ( int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    UNIFORM_01_ORDER_SAMPLE samples the Uniform 01 Order PDF.
//
//  Discussion:
//
//    In effect, this routine simply generates N samples of the
//    Uniform 01 PDF; but it generates them in order.  (Actually,
//    it generates them in descending order, but stores them in
//    the array in ascending order).  This saves the work of
//    sorting the results.  Moreover, if the order statistics
//    for another PDF are desired, and the inverse CDF is available,
//    then the desired values may be generated, presorted, by
//    calling this routine and using the results as input to the
//    inverse CDF routine.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    27 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Jerry Banks, editor,
//    Handbook of Simulation,
//    Engineering and Management Press Books, 1998, page 168.
//
//  Parameters:
//
//    Input, int N, the number of elements in the sample.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double UNIFORM_01_ORDER_SAMPLE[N], N samples of the Uniform 01 PDF, in
//    ascending order.
//
{
  int i;
  double u;
  double v;
  double *x;

  x = new double[n];

  v = 1.0;

  for ( i = n-1; 0 <= i; i-- )
  {
    u = r8_uniform_01 ( seed );
    v = v * pow ( u, 1.0 / static_cast<double>(i + 1 ) );
    x[i] = v;
  }

  return x;
}